

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

bool __thiscall Timidity::SF2Envelope::Update(SF2Envelope *this,Voice *v)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double local_30;
  double newvolume;
  double sec;
  Voice *v_local;
  SF2Envelope *this_local;
  
  local_30 = 0.0;
  switch((this->super_MinEnvelope).stage) {
  case '\0':
    iVar2 = v->sample_count;
    dVar5 = timecent_to_sec(this->DelayTime);
    if (dVar5 * (double)this->SampleRate <= (double)iVar2) {
      (this->super_MinEnvelope).stage = '\x01';
      bVar4 = Update(this,v);
      return bVar4;
    }
    return false;
  case '\x01':
    dVar5 = timecent_to_sec(this->AttackTime);
    if (0.0 < dVar5) {
      fVar1 = this->volume;
      local_30 = calc_rate((double)this->RateMul,dVar5);
      local_30 = (double)fVar1 + local_30;
    }
    else {
      local_30 = 1.0;
    }
    if (1.0 <= local_30) {
      this->volume = 0.0;
      this->HoldStart = v->sample_count;
      if (-32768.0 < this->HoldTime) {
        (this->super_MinEnvelope).stage = '\x02';
      }
      else {
        (this->super_MinEnvelope).stage = '\x03';
      }
      bVar4 = Update(this,v);
      return bVar4;
    }
    break;
  case '\x02':
    iVar2 = v->sample_count;
    iVar3 = this->HoldStart;
    dVar5 = timecent_to_sec(this->HoldTime);
    if (dVar5 * (double)this->SampleRate <= (double)(iVar2 - iVar3)) {
      (this->super_MinEnvelope).stage = '\x03';
      bVar4 = Update(this,v);
      return bVar4;
    }
    return false;
  case '\x03':
    dVar5 = timecent_to_sec(this->DecayTime);
    if (0.0 < dVar5) {
      fVar1 = this->volume;
      local_30 = calc_rate((double)this->RateMul_cB,dVar5);
      local_30 = (double)fVar1 + local_30;
    }
    else {
      local_30 = (double)this->SustainLevel;
    }
    if ((double)this->SustainLevel <= local_30) {
      local_30 = (double)this->SustainLevel;
      (this->super_MinEnvelope).stage = '\x04';
      (this->super_MinEnvelope).bUpdating = '\0';
      if ((v->status & 4) == 0) {
        v->status = v->status | 2;
      }
    }
    break;
  case '\x04':
    return false;
  case '\x05':
    dVar5 = timecent_to_sec(this->ReleaseTime);
    if (0.0 < dVar5) {
      fVar1 = this->volume;
      local_30 = calc_rate((double)this->RateMul_cB,dVar5);
      local_30 = (double)fVar1 + local_30;
    }
    else {
      local_30 = 1000.0;
    }
    if (960.0 <= local_30) {
      (this->super_MinEnvelope).stage = '\x06';
      shutoff_voice(v);
      (this->super_MinEnvelope).bUpdating = '\0';
      return true;
    }
    break;
  case '\x06':
    return true;
  }
  this->volume = (float)local_30;
  return false;
}

Assistant:

bool SF2Envelope::Update(Voice *v)
{
	double sec;
	double newvolume = 0;

	// NOTE! The volume scale is different for different stages of the
	// envelope generator:
	// Attack stage goes from 0.0 -> 1.0, multiplied directly to the output.
	// The following stages go from 0 -> -1000 cB (but recorded positively)
	switch (stage)
	{
	case SF2_DELAY:
		if (v->sample_count >= timecent_to_sec(DelayTime) * SampleRate)
		{
			stage = SF2_ATTACK;
			return Update(v);
		}
		return 0;

	case SF2_ATTACK:
		sec = timecent_to_sec(AttackTime);
		if (sec <= 0)
		{ // instantaneous attack
			newvolume = 1;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul, sec);
		}
		if (newvolume >= 1)
		{
			volume = 0;
			HoldStart = v->sample_count;
			if (HoldTime <= -32768)
			{ // hold time is 0, so skip right to decay
				stage = SF2_DECAY;
			}
			else
			{
				stage = SF2_HOLD;
			}
			return Update(v);
		}
		break;

	case SF2_HOLD:
		if (v->sample_count - HoldStart >= timecent_to_sec(HoldTime) * SampleRate)
		{
			stage = SF2_DECAY;
			return Update(v);
		}
		return 0;

	case SF2_DECAY:
		sec = timecent_to_sec(DecayTime);
		if (sec <= 0)
		{ // instantaneous decay
			newvolume = SustainLevel;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= SustainLevel)
		{
			newvolume = SustainLevel;
			stage = SF2_SUSTAIN;
			bUpdating = false;
			if (!(v->status & VOICE_RELEASING))
			{
				v->status |= VOICE_SUSTAINING;
			}
		}
		break;

	case SF2_SUSTAIN:
		// Stay here until released.
		return 0;

	case SF2_RELEASE:
		sec = timecent_to_sec(ReleaseTime);
		if (sec <= 0)
		{ // instantaneous release
			newvolume = 1000;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= 960)
		{
			stage = SF2_FINISHED;
			shutoff_voice(v);
			bUpdating = false;
			return 1;
		}
		break;

	case SF2_FINISHED:
		return 1;
	}
	volume = (float)newvolume;
	return 0;
}